

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::java::FileClassName_abi_cxx11_
          (string *__return_storage_ptr__,java *this,FileDescriptor *file)

{
  long *plVar1;
  long lVar2;
  string basename;
  string local_58;
  string local_38;
  
  if ((*(byte *)(*(long *)(this + 0x88) + 0x80) & 2) == 0) {
    local_38._M_string_length = 0;
    local_38.field_2._M_local_buf[0] = '\0';
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    lVar2 = std::__cxx11::string::rfind((char)*(undefined8 *)this,0x2f);
    if (lVar2 == -1) {
      std::__cxx11::string::_M_assign((string *)&local_38);
    }
    else {
      std::__cxx11::string::substr((ulong)&local_58,*(ulong *)this);
      std::__cxx11::string::operator=((string *)&local_38,(string *)&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
    StripProto(&local_58,&local_38);
    anon_unknown_0::UnderscoresToCamelCaseImpl(__return_storage_ptr__,&local_58,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,
                      CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,
                               local_38.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    plVar1 = *(long **)(*(long *)(this + 0x88) + 0x48);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    lVar2 = *plVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,lVar2,plVar1[1] + lVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

string FileClassName(const FileDescriptor* file) {
  if (file->options().has_java_outer_classname()) {
    return file->options().java_outer_classname();
  } else {
    string basename;
    string::size_type last_slash = file->name().find_last_of('/');
    if (last_slash == string::npos) {
      basename = file->name();
    } else {
      basename = file->name().substr(last_slash + 1);
    }
    return UnderscoresToCamelCaseImpl(StripProto(basename), true);
  }
}